

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void __thiscall VmFunction::UpdateLiveSets(VmFunction *this,VmModule *module)

{
  SmallArray<VmInstruction_*,_4U> *pSVar1;
  VmBlock *pVVar2;
  VmValue **ppVVar3;
  uint uVar4;
  VmBlock *pVVar5;
  VmInstruction **ppVVar6;
  ulong uVar7;
  char *__function;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  VmInstruction *pVVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  VmInstruction *pVVar15;
  VmBlock *pVVar16;
  bool bVar17;
  bool bVar18;
  SmallArray<VmBlock_*,_32U> worklist;
  SmallArray<VmBlock_*,_32U> local_148;
  
  local_148.allocator = module->allocator;
  local_148.data = local_148.little;
  local_148.count = 0;
  local_148.max = 0x20;
  pVVar16 = this->firstBlock;
  if (pVVar16 != (VmBlock *)0x0) {
    do {
      (pVVar16->liveIn).count = 0;
      (pVVar16->liveOut).count = 0;
      if (local_148.count == local_148.max) {
        SmallArray<VmBlock_*,_32U>::grow(&local_148,local_148.count);
      }
      if (local_148.data == (VmBlock **)0x0) goto LAB_0027e9e5;
      uVar7 = (ulong)local_148.count;
      local_148.count = local_148.count + 1;
      local_148.data[uVar7] = pVVar16;
      pVVar16 = pVVar16->nextSibling;
    } while (pVVar16 != (VmBlock *)0x0);
  }
  do {
    do {
      if (local_148.count == 0) {
        SmallArray<VmBlock_*,_32U>::~SmallArray(&local_148);
        return;
      }
      local_148.count = local_148.count - 1;
      pVVar16 = local_148.data[local_148.count];
      (pVVar16->liveOut).count = 0;
      if ((pVVar16->successors).count != 0) {
        pSVar1 = &pVVar16->liveOut;
        uVar7 = 0;
        do {
          pVVar2 = (pVVar16->successors).data[uVar7];
          if ((pVVar2->liveIn).count != 0) {
            uVar12 = 0;
            do {
              pVVar11 = (pVVar2->liveIn).data[uVar12];
              if (pVVar11->cmd == VM_INST_PHI) {
                uVar4 = (pVVar11->arguments).count;
                if (uVar4 != 0) {
                  uVar14 = 0;
                  bVar18 = false;
                  do {
                    ppVVar3 = (pVVar11->arguments).data;
                    pVVar15 = (VmInstruction *)ppVVar3[uVar14];
                    if ((pVVar15 == (VmInstruction *)0x0) || ((pVVar15->super_VmValue).typeID != 2))
                    {
                      pVVar15 = (VmInstruction *)0x0;
                    }
                    uVar8 = (uint)uVar14 | 1;
                    if (uVar4 <= uVar8) {
                      __assert_fail("index < count",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                    ,0x199,
                                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                                   );
                    }
                    pVVar5 = (VmBlock *)ppVVar3[uVar8];
                    if ((pVVar5 == (VmBlock *)0x0) || ((pVVar5->super_VmValue).typeID != 3)) {
                      pVVar5 = (VmBlock *)0x0;
                    }
                    if (pVVar5 == pVVar16) {
                      uVar4 = (pVVar16->liveOut).count;
                      uVar13 = (ulong)uVar4;
                      bVar17 = uVar13 != 0;
                      if (bVar17) {
                        if (*pSVar1->data == pVVar15) {
                          bVar18 = true;
                          goto LAB_0027e533;
                        }
                        uVar10 = 1;
                        do {
                          uVar9 = uVar10;
                          if (uVar13 == uVar9) break;
                          uVar10 = uVar9 + 1;
                        } while (pSVar1->data[uVar9] != pVVar15);
                        bVar17 = uVar9 < uVar13;
                      }
                      bVar18 = true;
                      if (!bVar17) {
                        if (uVar4 == (pVVar16->liveOut).max) {
                          SmallArray<VmInstruction_*,_4U>::grow(pSVar1,uVar4);
                        }
                        if (pSVar1->data == (VmInstruction **)0x0) goto LAB_0027e9a7;
                        uVar4 = (pVVar16->liveOut).count;
                        (pVVar16->liveOut).count = uVar4 + 1;
                        pSVar1->data[uVar4] = pVVar15;
                      }
                    }
LAB_0027e533:
                    uVar8 = (uint)uVar14 + 2;
                    uVar14 = (ulong)uVar8;
                    uVar4 = (pVVar11->arguments).count;
                  } while (uVar8 < uVar4);
                  if (bVar18) goto LAB_0027e69e;
                }
                uVar4 = (pVVar16->liveOut).count;
                uVar14 = (ulong)uVar4;
                bVar18 = uVar14 != 0;
                if (bVar18) {
                  if (*pSVar1->data == pVVar11) goto LAB_0027e69e;
                  uVar13 = 1;
                  do {
                    uVar10 = uVar13;
                    if (uVar14 == uVar10) break;
                    uVar13 = uVar10 + 1;
                  } while (pSVar1->data[uVar10] != pVVar11);
                  bVar18 = uVar10 < uVar14;
                }
                if (!bVar18) {
                  if (uVar4 == (pVVar16->liveOut).max) {
                    SmallArray<VmInstruction_*,_4U>::grow(pSVar1,uVar4);
                  }
LAB_0027e67d:
                  if (pSVar1->data == (VmInstruction **)0x0) goto LAB_0027e9a7;
                  uVar4 = (pVVar16->liveOut).count;
                  (pVVar16->liveOut).count = uVar4 + 1;
                  pSVar1->data[uVar4] = pVVar11;
                }
              }
              else {
                uVar4 = (pVVar16->liveOut).count;
                uVar14 = (ulong)uVar4;
                bVar18 = uVar14 != 0;
                if (bVar18) {
                  if (*pSVar1->data == pVVar11) goto LAB_0027e69e;
                  uVar13 = 1;
                  do {
                    uVar10 = uVar13;
                    if (uVar14 == uVar10) break;
                    uVar13 = uVar10 + 1;
                  } while (pSVar1->data[uVar10] != pVVar11);
                  bVar18 = uVar10 < uVar14;
                }
                if (!bVar18) {
                  if (uVar4 == (pVVar16->liveOut).max) {
                    SmallArray<VmInstruction_*,_4U>::grow(pSVar1,uVar4);
                  }
                  goto LAB_0027e67d;
                }
              }
LAB_0027e69e:
              uVar12 = uVar12 + 1;
            } while (uVar12 < (pVVar2->liveIn).count);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (pVVar16->successors).count);
      }
      pSVar1 = &pVVar16->liveIn;
      uVar4 = (pVVar16->liveIn).count;
      (pVVar16->liveIn).count = 0;
      if ((pVVar16->liveOut).count != 0) {
        uVar7 = 0;
        do {
          ppVVar6 = (pVVar16->liveOut).data;
          pVVar11 = ppVVar6[uVar7];
          if (pVVar11->parent != pVVar16) {
            uVar8 = (pVVar16->liveIn).count;
            uVar12 = (ulong)uVar8;
            bVar18 = uVar12 != 0;
            if (bVar18) {
              if (*pSVar1->data == pVVar11) goto LAB_0027e9c6;
              uVar14 = 1;
              do {
                uVar13 = uVar14;
                if (uVar12 == uVar13) break;
                uVar14 = uVar13 + 1;
              } while (pSVar1->data[uVar13] != pVVar11);
              bVar18 = uVar13 < uVar12;
            }
            if (bVar18) {
LAB_0027e9c6:
              __assert_fail("!curr->liveIn.contains(curr->liveOut[i])",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x957,"void VmFunction::UpdateLiveSets(VmModule *)");
            }
            if (uVar8 == (pVVar16->liveIn).max) {
              SmallArray<VmInstruction_*,_4U>::grow(pSVar1,uVar8);
            }
            if (pSVar1->data == (VmInstruction **)0x0) goto LAB_0027e9a7;
            pVVar11 = ppVVar6[uVar7];
            uVar8 = (pVVar16->liveIn).count;
            (pVVar16->liveIn).count = uVar8 + 1;
            pSVar1->data[uVar8] = pVVar11;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (pVVar16->liveOut).count);
      }
      for (pVVar11 = pVVar16->firstInstruction; pVVar11 != (VmInstruction *)0x0;
          pVVar11 = pVVar11->nextSibling) {
        if ((pVVar11->arguments).count != 0) {
          uVar7 = 0;
          do {
            pVVar15 = (VmInstruction *)(pVVar11->arguments).data[uVar7];
            if ((pVVar15 == (VmInstruction *)0x0) || ((pVVar15->super_VmValue).typeID != 2)) {
              pVVar15 = (VmInstruction *)0x0;
            }
            if (pVVar15 != (VmInstruction *)0x0) {
              if (pVVar11->cmd == VM_INST_PHI) {
                uVar8 = (pVVar16->liveIn).count;
                uVar12 = (ulong)uVar8;
                bVar18 = uVar12 != 0;
                if (bVar18) {
                  if (*pSVar1->data == pVVar11) goto LAB_0027e8a7;
                  uVar14 = 1;
                  do {
                    uVar13 = uVar14;
                    if (uVar12 == uVar13) break;
                    uVar14 = uVar13 + 1;
                  } while (pSVar1->data[uVar13] != pVVar11);
                  bVar18 = uVar13 < uVar12;
                }
                if (!bVar18) {
                  if (uVar8 == (pVVar16->liveIn).max) {
                    SmallArray<VmInstruction_*,_4U>::grow(pSVar1,uVar8);
                  }
                  ppVVar6 = pSVar1->data;
                  pVVar15 = pVVar11;
LAB_0027e889:
                  if (ppVVar6 == (VmInstruction **)0x0) goto LAB_0027e9a7;
                  uVar8 = (pVVar16->liveIn).count;
                  (pVVar16->liveIn).count = uVar8 + 1;
                  ppVVar6[uVar8] = pVVar15;
                }
              }
              else if (pVVar15->parent != pVVar16) {
                uVar8 = (pVVar16->liveIn).count;
                uVar12 = (ulong)uVar8;
                bVar18 = uVar12 != 0;
                if (bVar18) {
                  if (*pSVar1->data == pVVar15) goto LAB_0027e8a7;
                  uVar14 = 1;
                  do {
                    uVar13 = uVar14;
                    if (uVar12 == uVar13) break;
                    uVar14 = uVar13 + 1;
                  } while (pSVar1->data[uVar13] != pVVar15);
                  bVar18 = uVar13 < uVar12;
                }
                if (!bVar18) {
                  if (uVar8 == (pVVar16->liveIn).max) {
                    SmallArray<VmInstruction_*,_4U>::grow(pSVar1,uVar8);
                  }
                  ppVVar6 = pSVar1->data;
                  goto LAB_0027e889;
                }
              }
            }
LAB_0027e8a7:
            uVar7 = uVar7 + 1;
          } while (uVar7 < (pVVar11->arguments).count);
        }
      }
    } while ((uVar4 == (pVVar16->liveIn).count) || ((pVVar16->predecessors).count == 0));
    uVar7 = 0;
    do {
      pVVar2 = (pVVar16->predecessors).data[uVar7];
      uVar12 = (ulong)local_148.count;
      bVar18 = uVar12 != 0;
      if (uVar12 == 0) {
LAB_0027e920:
        if (!bVar18) {
          if (local_148.count == local_148.max) {
            SmallArray<VmBlock_*,_32U>::grow(&local_148,local_148.count);
          }
          if (local_148.data == (VmBlock **)0x0) goto LAB_0027e9e5;
          uVar12 = (ulong)local_148.count;
          local_148.count = local_148.count + 1;
          local_148.data[uVar12] = pVVar2;
        }
      }
      else if (*local_148.data != pVVar2) {
        uVar14 = 1;
        do {
          uVar13 = uVar14;
          if (uVar12 == uVar13) break;
          uVar14 = uVar13 + 1;
        } while (local_148.data[uVar13] != pVVar2);
        bVar18 = uVar13 < uVar12;
        goto LAB_0027e920;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (pVVar16->predecessors).count);
  } while( true );
LAB_0027e9a7:
  __function = 
  "void SmallArray<VmInstruction *, 4>::push_back(const T &) [T = VmInstruction *, N = 4]";
  goto LAB_0027e9bc;
LAB_0027e9e5:
  __function = "void SmallArray<VmBlock *, 32>::push_back(const T &) [T = VmBlock *, N = 32]";
LAB_0027e9bc:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

void VmFunction::UpdateLiveSets(VmModule *module)
{
	SmallArray<VmBlock*, 32> worklist(module->allocator);

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		curr->liveIn.clear();
		curr->liveOut.clear();

		worklist.push_back(curr);
	}

	while(!worklist.empty())
	{
		VmBlock *curr = worklist.back();
		worklist.pop_back();

		// Update block liveOut list
		curr->liveOut.clear();

		for(unsigned successorPos = 0; successorPos < curr->successors.size(); successorPos++)
		{
			VmBlock *successor = curr->successors[successorPos];

			for(unsigned k = 0; k < successor->liveIn.size(); k++)
			{
				VmInstruction *liveIn = successor->liveIn[k];

				bool found = false;

				if(liveIn->cmd == VM_INST_PHI)
				{
					for(unsigned argument = 0; argument < liveIn->arguments.size(); argument += 2)
					{
						VmInstruction *instruction = getType<VmInstruction>(liveIn->arguments[argument]);
						VmBlock *edge = getType<VmBlock>(liveIn->arguments[argument + 1]);

						if(edge == curr)
						{
							if(!curr->liveOut.contains(instruction))
								curr->liveOut.push_back(instruction);

							found = true;
						}
					}

					if(!found)
					{
						if(!curr->liveOut.contains(liveIn))
							curr->liveOut.push_back(liveIn);
					}
				}
				else
				{
					if(!curr->liveOut.contains(liveIn))
						curr->liveOut.push_back(liveIn);
				}
			}
		}

		unsigned liveInSize = curr->liveIn.size();

		// Update block liveIn list
		curr->liveIn.clear();

		// Add all liveOut variables that are not defined by current block
		for(unsigned i = 0; i < curr->liveOut.size(); i++)
		{
			if(curr->liveOut[i]->parent != curr)
			{
				assert(!curr->liveIn.contains(curr->liveOut[i]));
				curr->liveIn.push_back(curr->liveOut[i]);
			}
		}

		// Add all arguments from phi isntructions and all arguments that are not defined in current block
		for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
		{
			for(unsigned i = 0; i < inst->arguments.size(); i++)
			{
				if(VmInstruction *argument = getType<VmInstruction>(inst->arguments[i]))
				{
					if(inst->cmd == VM_INST_PHI)
					{
						if(!curr->liveIn.contains(inst))
							curr->liveIn.push_back(inst);
					}
					else
					{
						if(argument->parent != curr)
						{
							if(!curr->liveIn.contains(argument))
								curr->liveIn.push_back(argument);
						}
					}
				}
			}
		}

		if(liveInSize != curr->liveIn.size())
		{
			for(unsigned i = 0; i < curr->predecessors.size(); i++)
			{
				VmBlock *predecessor = curr->predecessors[i];

				if(!worklist.contains(predecessor))
					worklist.push_back(predecessor);
			}
		}
	}
}